

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_global(Context *ctx,RegisterType regtype,int regnum)

{
  int iVar1;
  char *pcVar2;
  char local_58 [8];
  char varname [64];
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  varname._56_4_ = regnum;
  varname._60_4_ = regtype;
  get_ARB1_varname_in_buf(ctx,regtype,regnum,local_58,0x40);
  push_output(ctx,&ctx->globals);
  if (varname._60_4_ == 0) {
    pcVar2 = arb1_float_temp(ctx);
    output_line(ctx,"%s %s;",pcVar2,local_58);
  }
  else if (varname._60_4_ == 3) {
    iVar1 = shader_is_pixel(ctx);
    if (iVar1 == 0) {
      if (ctx->profile_supports_nv4 == 0) {
        output_line(ctx,"ADDRESS %s;",local_58);
        if (ctx->profile_supports_nv2 == 0) {
          output_line(ctx,"TEMP addr%d;",(ulong)(uint)varname._56_4_);
        }
      }
      else {
        output_line(ctx,"INT TEMP %s;",local_58);
      }
    }
    else {
      iVar1 = shader_version_atleast(ctx,'\x01','\x04');
      if (iVar1 == 0) {
        pcVar2 = arb1_float_temp(ctx);
        output_line(ctx,"%s %s;",pcVar2,local_58);
        push_output(ctx,&ctx->mainline_top);
        output_line(ctx,"MOV %s, fragment.texcoord[%d];",local_58,(ulong)(uint)varname._56_4_);
        pop_output(ctx);
      }
    }
  }
  else {
    fail(ctx,"BUG: we used a register we don\'t know how to define.");
  }
  pop_output(ctx);
  return;
}

Assistant:

static void emit_ARB1_global(Context *ctx, RegisterType regtype, int regnum)
{
    // !!! FIXME: dependency on ARB1 profile.  // !!! FIXME about FIXME: huh?
    char varname[64];
    get_ARB1_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);
    switch (regtype)
    {
        case REG_TYPE_ADDRESS:
            if (shader_is_pixel(ctx))  // actually REG_TYPE_TEXTURE.
            {
                // We have to map texture registers to temps for ps_1_1, since
                //  they work like temps, initialize with tex coords, and the
                //  ps_1_1 TEX opcode expects to overwrite it.
                if (!shader_version_atleast(ctx, 1, 4))
                {
                    output_line(ctx, "%s %s;", arb1_float_temp(ctx), varname);
                    push_output(ctx, &ctx->mainline_top);
                    output_line(ctx, "MOV %s, fragment.texcoord[%d];",
                                varname, regnum);
                    pop_output(ctx);
                } // if
                break;
            } // if

            // nv4 replaced address registers with generic int registers.
            if (support_nv4(ctx))
                output_line(ctx, "INT TEMP %s;", varname);
            else
            {
                // nv2 has four-component address already, but stock arb1 has
                //  to emulate it in a temporary, and move components to the
                //  scalar ADDRESS register on demand.
                output_line(ctx, "ADDRESS %s;", varname);
                if (!support_nv2(ctx))
                    output_line(ctx, "TEMP addr%d;", regnum);
            } // else
            break;

        //case REG_TYPE_PREDICATE:
        //    output_line(ctx, "bvec4 %s;", varname);
        //    break;
        case REG_TYPE_TEMP:
            output_line(ctx, "%s %s;", arb1_float_temp(ctx), varname);
            break;
        //case REG_TYPE_LOOP:
        //    break; // no-op. We declare these in for loops at the moment.
        //case REG_TYPE_LABEL:
        //    break; // no-op. If we see it here, it means we optimized it out.
        default:
            fail(ctx, "BUG: we used a register we don't know how to define.");
            break;
    } // switch
    pop_output(ctx);
}